

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

bool __thiscall
cmConditionEvaluator::HandleLevel0
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  pointer pcVar1;
  pointer pcVar2;
  iterator __position;
  cmExpandedCommandArgument *argument;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  int iVar9;
  _Self __tmp;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> newArgs2;
  string local_c0;
  undefined1 local_a0;
  _List_node_base *local_98;
  long *local_90;
  long local_88;
  long local_80 [2];
  cmConditionEvaluator *local_70;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> local_68;
  string *local_48;
  MessageType *local_40;
  cmExpandedCommandArgument *local_38;
  
  p_Var8 = (newArgs->
           super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
           _M_impl._M_node.super__List_node_base._M_next;
  local_70 = this;
  local_48 = errorString;
  local_40 = status;
  do {
    bVar3 = p_Var8 == (_List_node_base *)newArgs;
    if (bVar3) {
      return bVar3;
    }
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"(","");
    argument = (cmExpandedCommandArgument *)(p_Var8 + 1);
    bVar4 = IsKeyword(local_70,&local_c0,argument);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      p_Var7 = (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      local_98 = p_Var8;
      local_38 = argument;
      if (p_Var7 == (_List_node_base *)newArgs) {
        bVar4 = true;
      }
      else {
        iVar9 = 1;
        do {
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"(","");
          bVar4 = IsKeyword(local_70,&local_c0,(cmExpandedCommandArgument *)(p_Var7 + 1));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,")","");
          bVar5 = IsKeyword(local_70,&local_c0,(cmExpandedCommandArgument *)(p_Var7 + 1));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          iVar9 = (iVar9 + (uint)bVar4) - (uint)bVar5;
          bVar4 = iVar9 != 0;
          p_Var7 = p_Var7->_M_next;
        } while ((p_Var7 != (_List_node_base *)newArgs) && (iVar9 != 0));
      }
      if (bVar4) {
        std::__cxx11::string::_M_replace
                  ((ulong)local_48,0,(char *)local_48->_M_string_length,0x4bbcaa);
        *local_40 = FATAL_ERROR;
      }
      else {
        local_68.
        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.
        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>::
        _M_range_insert<std::_List_iterator<cmExpandedCommandArgument>>
                  ((vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>> *)
                   &local_68,0,
                   (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      *)&local_98->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,p_Var7);
        pcVar1 = local_68.
                 super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        pcVar2 = local_68.
                 super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].Value._M_dataplus._M_p;
        paVar6 = &local_68.
                  super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].Value.field_2;
        local_68.
        super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
        _M_impl.super__Vector_impl_data._M_finish = pcVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar6) {
          operator_delete(pcVar2,paVar6->_M_allocated_capacity + 1);
        }
        bVar5 = IsTrue(local_70,&local_68,local_48,local_40);
        if (bVar5) {
          local_90 = local_80;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"1","");
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c0,local_90,local_88 + (long)local_90);
        }
        else {
          local_90 = local_80;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"0","");
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c0,local_90,local_88 + (long)local_90);
        }
        local_a0 = 1;
        std::__cxx11::string::operator=((string *)local_38,(string *)&local_c0);
        *(undefined1 *)
         &(((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
           &local_98[3]._M_next)->_M_impl)._M_node.super__List_node_base._M_next = local_a0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
        __position._M_node =
             (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
              &local_98->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        while (__position._M_node != p_Var7) {
          p_Var8 = (__position._M_node)->_M_next;
          std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
          ::_M_erase(newArgs,__position);
          __position._M_node = p_Var8;
        }
        std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~vector
                  (&local_68);
      }
      p_Var8 = local_98;
      if (bVar4) {
        return bVar3;
      }
    }
    p_Var8 = (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
              &p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel0(cmArgumentList &newArgs,
                  std::string &errorString,
                  cmake::MessageType &status)
{
  int reducible;
  do
    {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    while (arg != newArgs.end())
      {
      if (IsKeyword("(", *arg))
        {
        // search for the closing paren for this opening one
        cmArgumentList::iterator argClose;
        argClose = arg;
        argClose++;
        unsigned int depth = 1;
        while (argClose != newArgs.end() && depth)
          {
          if (this->IsKeyword("(", *argClose))
            {
              depth++;
            }
          if (this->IsKeyword(")", *argClose))
            {
              depth--;
            }
          argClose++;
          }
        if (depth)
          {
          errorString = "mismatched parenthesis in condition";
          status = cmake::FATAL_ERROR;
          return false;
          }
        // store the reduced args in this vector
        std::vector<cmExpandedCommandArgument> newArgs2;

        // copy to the list structure
        cmArgumentList::iterator argP1 = arg;
        argP1++;
        newArgs2.insert(newArgs2.end(), argP1, argClose);
        newArgs2.pop_back();
        // now recursively invoke IsTrue to handle the values inside the
        // parenthetical expression
        bool value =
          this->IsTrue(newArgs2, errorString, status);
        if(value)
          {
          *arg = cmExpandedCommandArgument("1", true);
          }
        else
          {
          *arg = cmExpandedCommandArgument("0", true);
          }
        argP1 = arg;
        argP1++;
        // remove the now evaluated parenthetical expression
        newArgs.erase(argP1,argClose);
        }
      ++arg;
      }
    }
  while (reducible);
  return true;
}